

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vcvtps2ph(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  Int32 IVar3;
  
  if (((pMyDisasm->Reserved_).VEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01')) {
LAB_0012ec11:
    failDecode(pMyDisasm);
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  if ((pMyDisasm->Reserved_).EVEX.W != '\0') goto LAB_0012ec11;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvtps2ph",10);
  IVar3 = 0x110000;
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\f';
    IVar3 = 0x140000;
  }
  (pMyDisasm->Instruction).Category = IVar3;
  IVar3 = 4;
  IVar2 = IVar3;
  if (UVar1 == '\0') {
LAB_0012ec71:
    (pMyDisasm->Reserved_).MemDecoration = IVar2;
    (pMyDisasm->Reserved_).Register_ = IVar3;
  }
  else {
    if (UVar1 == '\x01') {
      IVar2 = 9;
      goto LAB_0012ec71;
    }
    if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
      IVar3 = 8;
      IVar2 = 10;
      goto LAB_0012ec71;
    }
  }
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar3 = 4;
  }
  else if (UVar1 == '\x01') {
    IVar3 = 8;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0012ecb6;
    IVar3 = 0x10;
  }
  (pMyDisasm->Reserved_).Register_ = IVar3;
LAB_0012ecb6:
  decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vcvtps2ph(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtps2ph");
        #endif
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = HALF_MEM;
        pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
        if (GV.VEX.L == 0) {
          GV.MemDecoration = Arg1qword;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.MemDecoration = Arg1_m128_xmm;
          GV.Register_ = SSE_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.MemDecoration = Arg1_m256_ymm;
          GV.Register_ = AVX_REG;
        }
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        if (GV.VEX.L == 0) {
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.Register_ = AVX512_REG;
        }
        decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        getImmediat8(&pMyDisasm->Operand3, pMyDisasm);

      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }

}